

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySet.cxx
# Opt level: O0

set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
* anon_unknown.dwarf_1363c5f::GetTargetDependsClosure
            (map<const_cmGeneratorTarget_*,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
             *targetDepends,cmGeneratorTarget *tgt)

{
  bool bVar1;
  pointer ppVar2;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *this;
  cmGlobalGenerator *this_00;
  set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_> *this_01;
  cmGeneratorTarget *pcVar3;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *this_02;
  iterator __first;
  iterator __last;
  pair<std::_Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>,_bool>
  pVar4;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *depDeps;
  cmGeneratorTarget *local_f8;
  TargetType local_ec;
  reference pcStack_e8;
  TargetType type;
  cmTargetDepend *dep;
  iterator __end2;
  iterator __begin2;
  TargetDependSet *__range2;
  TargetDependSet *deps;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *retval;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  local_98;
  pair<const_cmGeneratorTarget_*const,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>
  local_60;
  _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>
  local_28;
  pair<std::_Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>,_bool>
  it;
  cmGeneratorTarget *tgt_local;
  map<const_cmGeneratorTarget_*,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
  *targetDepends_local;
  
  local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_98._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_98._M_t._M_impl._0_8_ = 0;
  local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  it._8_8_ = tgt;
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::set(&local_98);
  std::
  pair<const_cmGeneratorTarget_*const,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>
  ::pair<const_cmGeneratorTarget_*&,_true>(&local_60,(cmGeneratorTarget **)&it.second,&local_98);
  pVar4 = std::
          map<const_cmGeneratorTarget_*,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
          ::insert(targetDepends,&local_60);
  local_28 = pVar4.first._M_node;
  it.first._M_node._0_1_ = pVar4.second;
  std::
  pair<const_cmGeneratorTarget_*const,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>
  ::~pair(&local_60);
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~set(&local_98);
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>
           ::operator->(&local_28);
  this = &ppVar2->second;
  if (((byte)it.first._M_node & 1) != 0) {
    this_00 = cmGeneratorTarget::GetGlobalGenerator((cmGeneratorTarget *)it._8_8_);
    this_01 = &cmGlobalGenerator::GetTargetDirectDepends(this_00,(cmGeneratorTarget *)it._8_8_)->
               super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
    ;
    __end2 = std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::
             begin(this_01);
    dep = (cmTargetDepend *)
          std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::end
                    (this_01);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&dep), bVar1) {
      pcStack_e8 = std::_Rb_tree_const_iterator<cmTargetDepend>::operator*(&__end2);
      bVar1 = cmTargetDepend::IsCross(pcStack_e8);
      if ((!bVar1) && (bVar1 = cmTargetDepend::IsLink(pcStack_e8), bVar1)) {
        pcVar3 = cmTargetDepend::operator->(pcStack_e8);
        local_ec = cmGeneratorTarget::GetType(pcVar3);
        if ((local_ec == EXECUTABLE) ||
           ((local_ec == SHARED_LIBRARY || (local_ec == MODULE_LIBRARY)))) {
          local_f8 = cmTargetDepend::operator_cast_to_cmGeneratorTarget_(pcStack_e8);
          std::
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          ::insert(this,&local_f8);
        }
        pcVar3 = cmTargetDepend::operator_cast_to_cmGeneratorTarget_(pcStack_e8);
        this_02 = GetTargetDependsClosure(targetDepends,pcVar3);
        __first = std::
                  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                  ::begin(this_02);
        __last = std::
                 set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                 ::end(this_02);
        std::
        set<cmGeneratorTarget_const*,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
        ::insert<std::_Rb_tree_const_iterator<cmGeneratorTarget_const*>>
                  ((set<cmGeneratorTarget_const*,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                    *)this,(_Rb_tree_const_iterator<const_cmGeneratorTarget_*>)__first._M_node,
                   (_Rb_tree_const_iterator<const_cmGeneratorTarget_*>)__last._M_node);
      }
      std::_Rb_tree_const_iterator<cmTargetDepend>::operator++(&__end2);
    }
  }
  return this;
}

Assistant:

const std::set<const cmGeneratorTarget*>& GetTargetDependsClosure(
  std::map<const cmGeneratorTarget*, std::set<const cmGeneratorTarget*>>&
    targetDepends,
  const cmGeneratorTarget* tgt)
{
  auto it = targetDepends.insert({ tgt, {} });
  auto& retval = it.first->second;
  if (it.second) {
    auto const& deps = tgt->GetGlobalGenerator()->GetTargetDirectDepends(tgt);
    for (auto const& dep : deps) {
      if (!dep.IsCross() && dep.IsLink()) {
        auto type = dep->GetType();
        if (type == cmStateEnums::EXECUTABLE ||
            type == cmStateEnums::SHARED_LIBRARY ||
            type == cmStateEnums::MODULE_LIBRARY) {
          retval.insert(dep);
        }
        auto const& depDeps = GetTargetDependsClosure(targetDepends, dep);
        retval.insert(depDeps.begin(), depDeps.end());
      }
    }
  }
  return retval;
}